

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

char * __thiscall duckdb_snappy::SnappySinkAllocator::Allocate(SnappySinkAllocator *this,int size)

{
  char *p;
  int in_ESI;
  ulong uVar1;
  Datablock block;
  char *local_20;
  value_type *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = (ulong)in_ESI;
  if ((long)uVar1 < 0) {
    uVar1 = 0xffffffffffffffff;
  }
  p = (char *)operator_new__(uVar1);
  Datablock::Datablock((Datablock *)&local_20,p,(long)in_ESI);
  std::
  vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
  ::push_back((vector<duckdb_snappy::SnappySinkAllocator::Datablock,_std::allocator<duckdb_snappy::SnappySinkAllocator::Datablock>_>
               *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return local_20;
}

Assistant:

char* Allocate(int size) {
    Datablock block(new char[size], size);
    blocks_.push_back(block);
    return block.data;
  }